

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSThread_POSIX.c
# Opt level: O1

UINT64 OSThread_GetID(OS_THREAD *thr)

{
  return thr->id;
}

Assistant:

UINT64 OSThread_GetID(const OS_THREAD* thr)
{
#ifdef __APPLE__
	UINT64 idNum;
	pthread_threadid_np (thr->id, &idNum);
	return idNum;
#elif defined (__HAIKU__)
	return get_pthread_thread_id (thr->id);
#else
	return (UINT64)thr->id;
#endif
}